

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image-util.cc
# Opt level: O0

uint8_t SrgbTransform::linearToSrgb8bit(double x)

{
  int *piVar1;
  int local_3c [7];
  int i;
  int y;
  double *TABLE;
  double x_local;
  
  if (0.0 < x) {
    if (x < 1.0) {
      _i = SRGB_8BIT_TO_LINEAR_DOUBLE;
      local_3c[6] = 0;
      for (local_3c[5] = 0x80; local_3c[5] != 0; local_3c[5] = local_3c[5] >> 1) {
        if (*(double *)(SRGB_8BIT_TO_LINEAR_DOUBLE + (long)(local_3c[6] + local_3c[5]) * 8) <= x) {
          local_3c[6] = local_3c[5] + local_3c[6];
        }
      }
      TABLE = (double *)x;
      if (*(double *)(SRGB_8BIT_TO_LINEAR_DOUBLE + (long)(local_3c[6] + 1) * 8) - x <
          x - *(double *)(SRGB_8BIT_TO_LINEAR_DOUBLE + (long)local_3c[6] * 8)) {
        local_3c[2] = 0;
        local_3c[1] = 0xff;
        local_3c[0] = local_3c[6] + 1;
        piVar1 = std::min<int>(local_3c + 1,local_3c);
        piVar1 = std::max<int>(local_3c + 2,piVar1);
        x_local._7_1_ = (uint8_t)*piVar1;
      }
      else {
        local_3c[4] = 0;
        local_3c[3] = 0xff;
        piVar1 = std::min<int>(local_3c + 3,local_3c + 6);
        piVar1 = std::max<int>(local_3c + 4,piVar1);
        x_local._7_1_ = (uint8_t)*piVar1;
      }
    }
    else {
      x_local._7_1_ = 0xff;
    }
  }
  else {
    x_local._7_1_ = '\0';
  }
  return x_local._7_1_;
}

Assistant:

uint8_t linearToSrgb8bit(double x) {
	if (x <= 0.0)
		return 0;
	if (x >= 1.0)
		return 255;
	const double *TABLE = SRGB_8BIT_TO_LINEAR_DOUBLE;
	int y = 0;
	for (int i = 128; i != 0; i >>= 1) {
		if (TABLE[y + i] <= x)
			y += i;
	}
	if (x - TABLE[y] <= TABLE[y + 1] - x)
		return static_cast<uint8_t>((std::max)(0, (std::min)(255, y)));
	else
		return static_cast<uint8_t>((std::max)(0, (std::min)(255, y + 1)));
}